

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_avx2.c
# Opt level: O1

void av1_apply_temporal_filter_avx2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  byte bVar6;
  double dVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 (*pauVar15) [32];
  uint16_t *puVar16;
  ulong uVar17;
  ulong uVar18;
  uint32_t *puVar19;
  int iVar20;
  undefined7 in_register_00000011;
  ulong uVar21;
  int iVar22;
  undefined4 *puVar23;
  uint uVar24;
  long lVar25;
  undefined1 (*pauVar26) [32];
  uint uVar27;
  undefined4 *puVar28;
  int *piVar29;
  undefined1 (*pauVar30) [16];
  undefined1 (*pauVar31) [32];
  ulong uVar32;
  undefined4 *puVar33;
  int subblock_idx;
  int iVar34;
  long lVar35;
  int iVar36;
  undefined1 (*pauVar37) [32];
  int iVar38;
  undefined1 (*pauVar39) [32];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 extraout_var [56];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar50 [16];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [28];
  undefined1 auVar63 [28];
  undefined1 auVar64 [32];
  double d_factor_decayed [4];
  double subblock_mses_scaled [4];
  double d_factor [4];
  __m256i vsrc [5];
  __m256d subblock_mses_reg [4];
  uint16_t frame_sse [1088];
  uint32_t luma_sse_sum [1024];
  uint32_t acc_5x5_sse [32] [32];
  ulong local_2be0;
  int local_2bcc;
  double local_2b80;
  double local_2b70;
  double local_2b10 [4];
  double local_2af0 [4];
  undefined1 local_2ad0 [16];
  double local_2ac0 [4];
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined1 local_2a60 [32];
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined1 local_2a20 [32];
  double local_2a00;
  double dStack_29f8;
  double dStack_29f0;
  double dStack_29e8;
  undefined1 local_29e0 [32];
  double local_29c0;
  double dStack_29b8;
  double dStack_29b0;
  double dStack_29a8;
  double local_29a0;
  double dStack_2998;
  double dStack_2990;
  double dStack_2988;
  double local_2980;
  double dStack_2978;
  double dStack_2970;
  double dStack_2968;
  double local_2960 [7];
  double dStack_2928;
  double local_2920;
  double dStack_2918;
  double dStack_2910;
  double dStack_2908;
  double local_2900;
  double dStack_28f8;
  double dStack_28f0;
  double dStack_28e8;
  ushort local_28e0 [16];
  undefined4 auStack_28c0 [8];
  undefined4 auStack_28a0 [528];
  int local_2060 [1024];
  undefined4 local_1060 [1036];
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar55 [32];
  
  uVar18 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  iVar22 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar20 = (frame_to_filter->field_3).field_0.y_crop_height;
  if (iVar20 < iVar22) {
    iVar22 = iVar20;
  }
  bVar2 = block_size_high[uVar18];
  dVar48 = (double)q_factor / 20.0;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar48 * dVar48;
  auVar41 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar49);
  auVar49 = vcmpsd_avx(auVar49,ZEXT816(0x3ee4f8b588e368f1),1);
  auVar60._8_8_ = 0x3ee4f8b588e368f1;
  auVar60._0_8_ = 0x3ee4f8b588e368f1;
  auVar49 = vblendvpd_avx(auVar41,auVar60,auVar49);
  dVar48 = (double)q_factor * 0.015625;
  bVar3 = block_size_wide[uVar18];
  local_2b70 = dVar48 * dVar48 * 0.5;
  dVar48 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar48;
  auVar46 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar41);
  local_2ac0[0] = 0.0;
  local_2ac0[1] = 0.0;
  local_2ac0[2] = 0.0;
  local_2ac0[3] = 0.0;
  lVar35 = 0;
  memset(local_28e0,0,0x880);
  memset(local_2060,0,0x1000);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = (double)iVar22 * 0.1;
  auVar41 = vmaxsd_avx(auVar42,ZEXT816(0x3ff0000000000000));
  auVar56 = ZEXT1664(auVar41);
  do {
    auVar42 = vpmovsxwd_avx(ZEXT416((uint)subblock_mvs[lVar35]));
    auVar42 = vcvtdq2pd_avx(auVar42);
    dVar40 = auVar42._0_8_ * auVar42._0_8_;
    dVar47 = auVar42._8_8_ * auVar42._8_8_;
    auVar43._0_8_ = dVar40 + dVar47;
    auVar43._8_8_ = dVar40 + dVar47;
    if (auVar43._0_8_ < 0.0) {
      auVar56._0_8_ = sqrt(auVar43._0_8_);
      auVar56._8_56_ = extraout_var;
      auVar42 = auVar56._0_16_;
      auVar56 = ZEXT864(auVar41._0_8_);
    }
    else {
      auVar42 = vsqrtsd_avx(auVar43,auVar43);
    }
    auVar44._0_8_ = auVar42._0_8_ / auVar56._0_8_;
    auVar44._8_8_ = auVar42._8_8_;
    auVar42 = vmaxsd_avx(auVar44,ZEXT816(0x3ff0000000000000));
    local_2ac0[lVar35] = auVar42._0_8_;
    lVar35 = lVar35 + 1;
  } while (lVar35 != 4);
  if (q_factor < 0x80) {
    local_2b80 = auVar49._0_8_;
    local_2b70 = local_2b80;
  }
  if (0 < num_planes) {
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar48;
    auVar49 = vcmpsd_avx(auVar45,ZEXT816(0x3ee4f8b588e368f1),1);
    local_2ad0 = vblendvpd_avx(auVar46,auVar60,auVar49);
    uVar18 = 0;
    local_2a00 = local_2ac0[0];
    dStack_29f8 = local_2ac0[1];
    dStack_29f0 = local_2ac0[2];
    dStack_29e8 = local_2ac0[3];
    local_2bcc = 0;
    do {
      iVar22 = mbd->plane[uVar18].subsampling_x;
      iVar20 = mbd->plane[uVar18].subsampling_y;
      bVar8 = bVar2 >> ((byte)iVar20 & 0x1f);
      uVar10 = (uint)bVar8;
      uVar13 = (ulong)uVar10;
      bVar9 = bVar3 >> ((byte)iVar22 & 0x1f);
      uVar11 = (uint)bVar9;
      uVar14 = (ulong)uVar11;
      iVar22 = iVar22 - mbd->plane[0].subsampling_x;
      iVar20 = iVar20 - mbd->plane[0].subsampling_y;
      bVar4 = (byte)iVar20;
      bVar6 = (byte)iVar22;
      dVar48 = 0.04;
      if (uVar18 != 0) {
        dVar48 = 1.0 / (double)((1 << (bVar4 + bVar6 & 0x1f)) + 0x19);
      }
      uVar5 = *(uint *)((long)frame_to_filter->store_buf_adr + (ulong)(uVar18 != 0) * 4 + -0x28);
      pauVar15 = (undefined1 (*) [32])
                 (frame_to_filter->store_buf_adr[uVar18 - 4] +
                 (int)(uVar11 * mb_col + uVar5 * uVar10 * mb_row));
      dVar40 = log(noise_levels[uVar18] + noise_levels[uVar18] + 5.0);
      if ((uVar18 == 1) && (uVar10 != 0)) {
        uVar12 = 1 << (bVar4 & 0x1f);
        uVar27 = 1 << (bVar6 & 0x1f);
        if ((int)uVar27 < 2) {
          uVar27 = 1;
        }
        if ((int)uVar12 < 2) {
          uVar12 = 1;
        }
        local_2be0 = 0;
        do {
          if (uVar11 != 0) {
            uVar32 = 0;
            do {
              if (iVar20 != 0x1f) {
                iVar38 = ((int)uVar32 << (bVar6 & 0x1f)) +
                         ((int)local_2be0 << (bVar4 & 0x1f)) * 0x22;
                lVar35 = uVar32 + local_2be0 * 0x20;
                uVar24 = 0;
                do {
                  if (iVar22 != 0x1f) {
                    iVar34 = local_2060[lVar35];
                    uVar21 = (ulong)uVar27;
                    iVar36 = iVar38;
                    do {
                      iVar34 = iVar34 + (uint)local_28e0[iVar36];
                      iVar36 = iVar36 + 1;
                      uVar21 = uVar21 - 1;
                    } while (uVar21 != 0);
                    local_2060[lVar35] = iVar34;
                  }
                  uVar24 = uVar24 + 1;
                  iVar38 = iVar38 + 0x22;
                } while (uVar24 != uVar12);
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != uVar14);
          }
          local_2be0 = local_2be0 + 1;
        } while (local_2be0 != uVar10);
      }
      lVar35 = (long)local_2bcc;
      pauVar31 = (undefined1 (*) [32])(pred + lVar35);
      if (uVar11 == 0x20) {
        auVar61._8_4_ = 0x40e00000;
        auVar61._0_8_ = 0x40e0000040e00000;
        auVar61._12_4_ = 0x40e00000;
        auVar61._16_4_ = 0x40e00000;
        auVar61._20_4_ = 0x40e00000;
        auVar61._24_4_ = 0x40e00000;
        auVar61._28_4_ = 0x40e00000;
        auVar62._8_4_ = 0x4b38aa3b;
        auVar62._0_8_ = 0x4b38aa3b4b38aa3b;
        auVar62._12_4_ = 0x4b38aa3b;
        auVar62._16_4_ = 0x4b38aa3b;
        auVar62._20_4_ = 0x4b38aa3b;
        auVar62._24_4_ = 0x4b38aa3b;
        auVar63._8_4_ = 0x447a0000;
        auVar63._0_8_ = 0x447a0000447a0000;
        auVar63._12_4_ = 0x447a0000;
        auVar63._16_4_ = 0x447a0000;
        auVar63._20_4_ = 0x447a0000;
        auVar63._24_4_ = 0x447a0000;
        auVar64._8_4_ = 0x3f000000;
        auVar64._0_8_ = 0x3f0000003f000000;
        auVar64._12_4_ = 0x3f000000;
        auVar64._16_4_ = 0x3f000000;
        auVar64._20_4_ = 0x3f000000;
        auVar64._24_4_ = 0x3f000000;
        auVar64._28_4_ = 0x3f000000;
        if (uVar10 != 0) {
          lVar25 = 0;
          pauVar26 = pauVar31;
          do {
            auVar53 = vpmaxub_avx2(*pauVar15,*pauVar26);
            auVar52 = vpminub_avx2(*pauVar15,*pauVar26);
            auVar52 = vpsubusb_avx2(auVar53,auVar52);
            auVar53 = vpmovzxbw_avx2(auVar52._0_16_);
            auVar52 = vpmovzxbw_avx2(auVar52._16_16_);
            auVar53 = vpmullw_avx2(auVar53,auVar53);
            auVar52 = vpmullw_avx2(auVar52,auVar52);
            *(undefined1 (*) [32])((long)local_28e0 + lVar25) = auVar53;
            *(undefined1 (*) [32])((long)auStack_28c0 + lVar25) = auVar52;
            *(undefined4 *)((long)auStack_28a0 + lVar25) = 0;
            pauVar15 = (undefined1 (*) [32])(*pauVar15 + uVar5);
            pauVar26 = (undefined1 (*) [32])(*pauVar26 + uVar14);
            lVar25 = lVar25 + 0x44;
          } while (uVar10 * 0x44 != (int)lVar25);
        }
      }
      else {
        auVar61._8_4_ = 0x40e00000;
        auVar61._0_8_ = 0x40e0000040e00000;
        auVar61._12_4_ = 0x40e00000;
        auVar61._16_4_ = 0x40e00000;
        auVar61._20_4_ = 0x40e00000;
        auVar61._24_4_ = 0x40e00000;
        auVar61._28_4_ = 0x40e00000;
        auVar62._8_4_ = 0x4b38aa3b;
        auVar62._0_8_ = 0x4b38aa3b4b38aa3b;
        auVar62._12_4_ = 0x4b38aa3b;
        auVar62._16_4_ = 0x4b38aa3b;
        auVar62._20_4_ = 0x4b38aa3b;
        auVar62._24_4_ = 0x4b38aa3b;
        auVar63._8_4_ = 0x447a0000;
        auVar63._0_8_ = 0x447a0000447a0000;
        auVar63._12_4_ = 0x447a0000;
        auVar63._16_4_ = 0x447a0000;
        auVar63._20_4_ = 0x447a0000;
        auVar63._24_4_ = 0x447a0000;
        auVar64._8_4_ = 0x3f000000;
        auVar64._0_8_ = 0x3f0000003f000000;
        auVar64._12_4_ = 0x3f000000;
        auVar64._16_4_ = 0x3f000000;
        auVar64._20_4_ = 0x3f000000;
        auVar64._24_4_ = 0x3f000000;
        auVar64._28_4_ = 0x3f000000;
        if (uVar10 != 0) {
          lVar25 = 0;
          pauVar26 = pauVar31;
          do {
            auVar53 = vpmovzxbw_avx2(*(undefined1 (*) [16])*pauVar15);
            auVar52 = vpmovzxbw_avx2(*(undefined1 (*) [16])*pauVar26);
            auVar53 = vpsubw_avx2(auVar53,auVar52);
            auVar53 = vpmullw_avx2(auVar53,auVar53);
            *(undefined1 (*) [32])((long)local_28e0 + lVar25) = auVar53;
            *(undefined4 *)((long)auStack_28c0 + lVar25) = 0;
            pauVar15 = (undefined1 (*) [32])(*pauVar15 + uVar5);
            pauVar26 = (undefined1 (*) [32])(*pauVar26 + uVar14);
            lVar25 = lVar25 + 0x44;
          } while (uVar10 * 0x44 != (int)lVar25);
        }
      }
      if (uVar11 != 0) {
        puVar28 = local_1060;
        uVar32 = 0;
        do {
          pauVar30 = (undefined1 (*) [16])(local_28e0 + (uVar32 - 2));
          if (uVar32 == 0) {
            pauVar30 = (undefined1 (*) [16])local_28e0;
          }
          lVar25 = 0x40;
          do {
            auVar49 = *pauVar30;
            if (uVar32 == 0) {
              auVar49 = vpshufd_avx(auVar49,0x94);
              auVar49 = vpshuflw_avx(auVar49,0x40);
            }
            if (uVar32 == uVar11 - 4) {
              auVar49 = vpshufhw_avx(auVar49,0x54);
            }
            auVar53 = vpmovzxwd_avx2(auVar49);
            *(undefined1 (*) [32])((long)&local_2aa0 + lVar25) = auVar53;
            pauVar30 = (undefined1 (*) [16])(pauVar30[4] + 4);
            lVar25 = lVar25 + 0x20;
          } while (lVar25 != 0xa0);
          local_2aa0 = local_2a60._0_8_;
          uStack_2a98 = local_2a60._8_8_;
          uStack_2a90 = local_2a60._16_8_;
          uStack_2a88 = local_2a60._24_8_;
          local_2a80 = local_2a60._0_8_;
          uStack_2a78 = local_2a60._8_8_;
          uStack_2a70 = local_2a60._16_8_;
          uStack_2a68 = local_2a60._24_8_;
          if (uVar10 != 0) {
            uVar21 = 0;
            puVar33 = puVar28;
            do {
              uStack_2a88 = uStack_2a68;
              uStack_2a90 = uStack_2a70;
              uStack_2a98 = uStack_2a78;
              local_2aa0 = local_2a80;
              auVar56 = ZEXT1664((undefined1  [16])0x0);
              lVar25 = 0;
              do {
                auVar53 = vpaddd_avx2(auVar56._0_32_,
                                      *(undefined1 (*) [32])((long)&local_2aa0 + lVar25));
                auVar56 = ZEXT3264(auVar53);
                lVar25 = lVar25 + 0x20;
              } while (lVar25 != 0xa0);
              local_2a80 = local_2a60._0_8_;
              uStack_2a78 = local_2a60._8_8_;
              uStack_2a70 = local_2a60._16_8_;
              uStack_2a68 = local_2a60._24_8_;
              local_2a60._8_8_ = uStack_2a38;
              local_2a60._0_8_ = local_2a40;
              local_2a60._16_8_ = uStack_2a30;
              local_2a60._24_8_ = uStack_2a28;
              local_2a40 = local_2a20._0_8_;
              uStack_2a38 = local_2a20._8_8_;
              uStack_2a30 = local_2a20._16_8_;
              uStack_2a28 = local_2a20._24_8_;
              if ((long)(int)(uVar10 - 4) < (long)uVar21) {
              }
              else {
                auVar49 = *pauVar30;
                if (uVar32 == 0) {
                  auVar49 = vpshufd_avx(auVar49,0x94);
                  auVar49 = vpshuflw_avx(auVar49,0x40);
                }
                if (uVar32 == uVar11 - 4) {
                  auVar49 = vpshufhw_avx(auVar49,0x54);
                }
                local_2a20 = vpmovzxwd_avx2(auVar49);
                pauVar30 = (undefined1 (*) [16])(pauVar30[4] + 4);
              }
              lVar25 = 0;
              puVar23 = puVar33;
              do {
                auVar52 = vpand_avx2(auVar53,*(undefined1 (*) [32])((long)sse_bytemask[0] + lVar25))
                ;
                auVar49 = vphaddd_avx(auVar52._16_16_,auVar52._0_16_);
                auVar49 = vphaddd_avx(auVar49,auVar49);
                auVar49 = vphaddd_avx(auVar49,auVar49);
                *puVar23 = auVar49._0_4_;
                lVar25 = lVar25 + 0x20;
                puVar23 = puVar23 + 1;
              } while (lVar25 != 0x80);
              uVar21 = uVar21 + 1;
              puVar33 = puVar33 + 0x20;
            } while (uVar21 != uVar13);
          }
          uVar32 = uVar32 + 4;
          puVar28 = puVar28 + 4;
        } while (uVar32 < uVar14);
      }
      local_2b10[3] = 1.0 / ((dVar40 + 0.5) * local_2b70 * (double)local_2ad0._0_8_);
      local_2b10[0] = local_2b10[3] * local_2a00;
      local_2b10[1] = local_2b10[3] * dStack_29f8;
      local_2b10[2] = local_2b10[3] * dStack_29f0;
      local_2b10[3] = local_2b10[3] * dStack_29e8;
      auVar53 = vcvtdq2pd_avx(*(undefined1 (*) [16])subblock_mses);
      local_2af0[0] = auVar53._0_8_ * 0.008333333333333333;
      local_2af0[1] = auVar53._8_8_ * 0.008333333333333333;
      local_2af0[2] = auVar53._16_8_ * 0.008333333333333333;
      local_2af0[3] = auVar53._24_8_ * 0.008333333333333333;
      if (tf_wgt_calc_lvl == 0) {
        auVar56 = ZEXT1664(ZEXT816(0x401c000000000000));
        if (uVar10 != 0) {
          uVar32 = 0;
          puVar28 = local_1060;
          piVar29 = local_2060;
          iVar22 = 0;
          do {
            if (uVar11 != 0) {
              uVar21 = 0;
              do {
                uVar17 = (ulong)(((uint)(bVar9 >> 1 <= uVar21) | (uint)(bVar8 >> 1 <= uVar32) * 2)
                                << 3);
                dVar40 = ((double)(uint)(piVar29[uVar21] + puVar28[uVar21]) * dVar48 *
                          0.041666666666666664 + *(double *)((long)local_2af0 + uVar17)) *
                         *(double *)((long)local_2b10 + uVar17);
                bVar4 = (*pauVar31)[uVar21];
                auVar51._0_8_ = -dVar40;
                auVar51._8_8_ = 0x8000000000000000;
                auVar46._8_8_ = 0;
                auVar46._0_8_ = dVar40;
                auVar49 = vcmpsd_avx(auVar46,auVar56._0_16_,1);
                auVar57._8_8_ = 0xc01c000000000000;
                auVar57._0_8_ = 0xc01c000000000000;
                auVar49 = vblendvpd_avx(auVar57,auVar51,auVar49);
                dVar40 = exp(auVar49._0_8_);
                auVar56 = ZEXT1664(ZEXT816(0x401c000000000000));
                count[lVar35 + (long)iVar22 + uVar21] =
                     count[lVar35 + (long)iVar22 + uVar21] + (short)(int)(dVar40 * 1000.0);
                accum[lVar35 + (long)iVar22 + uVar21] =
                     accum[lVar35 + (long)iVar22 + uVar21] + (uint)bVar4 * (int)(dVar40 * 1000.0);
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
              iVar22 = iVar22 + (int)uVar21;
            }
            uVar32 = uVar32 + 1;
            piVar29 = piVar29 + 0x20;
            puVar28 = puVar28 + 0x20;
            pauVar31 = (undefined1 (*) [32])(*pauVar31 + uVar14);
          } while (uVar32 != uVar13);
        }
      }
      else {
        local_2960[0] = local_2af0[0];
        local_2960[1] = local_2af0[0];
        local_2960[2] = local_2af0[0];
        local_2960[3] = local_2af0[0];
        local_2960[4] = local_2af0[1];
        local_2960[5] = local_2af0[1];
        local_2960[6] = local_2af0[1];
        dStack_2928 = local_2af0[1];
        local_2920 = local_2af0[2];
        dStack_2918 = local_2af0[2];
        dStack_2910 = local_2af0[2];
        dStack_2908 = local_2af0[2];
        local_29e0._8_8_ = local_2b10[0];
        local_29e0._0_8_ = local_2b10[0];
        local_29e0._16_8_ = local_2b10[0];
        local_29e0._24_8_ = local_2b10[0];
        local_2900 = local_2af0[3];
        dStack_28f8 = local_2af0[3];
        dStack_28f0 = local_2af0[3];
        dStack_28e8 = local_2af0[3];
        local_29c0 = local_2b10[1];
        dStack_29b8 = local_2b10[1];
        dStack_29b0 = local_2b10[1];
        dStack_29a8 = local_2b10[1];
        local_29a0 = local_2b10[2];
        dStack_2998 = local_2b10[2];
        dStack_2990 = local_2b10[2];
        dStack_2988 = local_2b10[2];
        local_2980 = local_2b10[3];
        dStack_2978 = local_2b10[3];
        dStack_2970 = local_2b10[3];
        dStack_2968 = local_2b10[3];
        if (uVar10 != 0) {
          puVar19 = accum + lVar35;
          puVar16 = count + lVar35;
          pauVar15 = (undefined1 (*) [32])local_1060;
          pauVar26 = (undefined1 (*) [32])local_2060;
          uVar32 = 0;
          do {
            if (uVar11 != 0) {
              uVar21 = 0;
              pauVar37 = pauVar26;
              pauVar39 = pauVar15;
              do {
                auVar53 = vlddqu_avx(*pauVar39);
                auVar52 = vlddqu_avx(*pauVar37);
                auVar53 = vpaddd_avx2(auVar52,auVar53);
                auVar52 = vcvtdq2pd_avx(auVar53._0_16_);
                auVar54 = vcvtdq2pd_avx(auVar53._16_16_);
                uVar17 = (ulong)(((uint)(bVar9 >> 1 <= uVar21) | (uint)(bVar8 >> 1 <= uVar32) * 2)
                                << 5);
                dVar40 = *(double *)((long)local_2960 + uVar17 + 8);
                dVar47 = *(double *)((long)local_2960 + uVar17 + 0x10);
                dVar7 = *(double *)((long)local_2960 + uVar17 + 0x18);
                auVar53 = *(undefined1 (*) [32])(local_29e0 + uVar17);
                auVar58._0_8_ =
                     auVar53._0_8_ *
                     (*(double *)((long)local_2960 + uVar17) +
                     dVar48 * auVar52._0_8_ * 0.041666666666666664);
                auVar58._8_8_ =
                     auVar53._8_8_ * (dVar40 + dVar48 * auVar52._8_8_ * 0.041666666666666664);
                auVar58._16_8_ =
                     auVar53._16_8_ * (dVar47 + dVar48 * auVar52._16_8_ * 0.041666666666666664);
                auVar58._24_8_ =
                     auVar53._24_8_ * (dVar7 + dVar48 * auVar52._24_8_ * 0.041666666666666664);
                auVar52._0_8_ =
                     auVar53._0_8_ *
                     (*(double *)((long)local_2960 + uVar17) +
                     dVar48 * auVar54._0_8_ * 0.041666666666666664);
                auVar52._8_8_ =
                     auVar53._8_8_ * (dVar40 + dVar48 * auVar54._8_8_ * 0.041666666666666664);
                auVar52._16_8_ =
                     auVar53._16_8_ * (dVar47 + dVar48 * auVar54._16_8_ * 0.041666666666666664);
                auVar52._24_8_ =
                     auVar53._24_8_ * (dVar7 + dVar48 * auVar54._24_8_ * 0.041666666666666664);
                auVar49 = vcvtpd2ps_avx(auVar58);
                auVar41 = vcvtpd2ps_avx(auVar52);
                auVar53._16_16_ = auVar41;
                auVar53._0_16_ = auVar49;
                auVar53 = vminps_avx(auVar53,auVar61);
                auVar53 = vsubps_avx(SUB6432(ZEXT864(0),0),auVar53);
                auVar54._0_4_ = (int)(auVar62._0_4_ * auVar53._0_4_);
                auVar54._4_4_ = (int)(auVar62._4_4_ * auVar53._4_4_);
                auVar54._8_4_ = (int)(auVar62._8_4_ * auVar53._8_4_);
                auVar54._12_4_ = (int)(auVar62._12_4_ * auVar53._12_4_);
                auVar54._16_4_ = (int)(auVar62._16_4_ * auVar53._16_4_);
                auVar54._20_4_ = (int)(auVar62._20_4_ * auVar53._20_4_);
                auVar54._24_4_ = (int)(auVar62._24_4_ * auVar53._24_4_);
                auVar54._28_4_ = (int)auVar53._28_4_;
                auVar59._8_4_ = 0x3f7f127f;
                auVar59._0_8_ = 0x3f7f127f3f7f127f;
                auVar59._12_4_ = 0x3f7f127f;
                auVar59._16_4_ = 0x3f7f127f;
                auVar59._20_4_ = 0x3f7f127f;
                auVar59._24_4_ = 0x3f7f127f;
                auVar59._28_4_ = 0x3f7f127f;
                auVar53 = vpaddd_avx2(auVar54,auVar59);
                auVar50._0_4_ = (int)(auVar64._0_4_ + auVar63._0_4_ * auVar53._0_4_);
                auVar50._4_4_ = (int)(auVar64._4_4_ + auVar63._4_4_ * auVar53._4_4_);
                auVar50._8_4_ = (int)(auVar64._8_4_ + auVar63._8_4_ * auVar53._8_4_);
                auVar50._12_4_ = (int)(auVar64._12_4_ + auVar63._12_4_ * auVar53._12_4_);
                auVar55._16_4_ = (int)(auVar64._16_4_ + auVar63._16_4_ * auVar53._16_4_);
                auVar55._0_16_ = auVar50;
                auVar55._20_4_ = (int)(auVar64._20_4_ + auVar63._20_4_ * auVar53._20_4_);
                auVar55._24_4_ = (int)(auVar64._24_4_ + auVar63._24_4_ * auVar53._24_4_);
                auVar55._28_4_ = (int)(auVar64._28_4_ + auVar53._28_4_);
                auVar49 = vpackusdw_avx(auVar50,auVar55._16_16_);
                auVar49 = vpaddw_avx(auVar49,*(undefined1 (*) [16])(puVar16 + uVar21));
                *(undefined1 (*) [16])(puVar16 + uVar21) = auVar49;
                auVar1._8_8_ = 0;
                auVar1._0_8_ = *(ulong *)(*pauVar31 + uVar21);
                auVar53 = vpmovzxbd_avx2(auVar1);
                auVar53 = vpmulld_avx2(auVar55,auVar53);
                auVar53 = vpaddd_avx2(auVar53,*(undefined1 (*) [32])(puVar19 + uVar21));
                *(undefined1 (*) [32])(puVar19 + uVar21) = auVar53;
                uVar21 = uVar21 + 8;
                pauVar37 = pauVar37 + 1;
                pauVar39 = pauVar39 + 1;
              } while (uVar21 < uVar14);
            }
            uVar32 = uVar32 + 1;
            pauVar31 = (undefined1 (*) [32])(*pauVar31 + uVar14);
            puVar19 = (uint32_t *)((long)puVar19 + (ulong)(uVar11 * 4));
            puVar16 = (uint16_t *)((long)puVar16 + (ulong)(uVar11 * 2));
            pauVar26 = pauVar26 + 4;
            pauVar15 = pauVar15 + 4;
          } while (uVar32 != uVar13);
        }
      }
      local_2bcc = local_2bcc + uVar11 * uVar10;
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uint)num_planes);
  }
  return;
}

Assistant:

void av1_apply_temporal_filter_avx2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with avx2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with avx2!");
  assert(!is_high_bitdepth && "Only support low bit-depth with avx2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint16_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint8_t *ref = frame_to_filter->buffers[plane] + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx];
            }
          }
        }
      }
    }

    apply_temporal_filter(ref, frame_stride, pred + plane_offset, plane_w,
                          plane_w, plane_h, subblock_mses, accum + plane_offset,
                          count + plane_offset, frame_sse, luma_sse_sum,
                          inv_num_ref_pixels, decay_factor, inv_factor,
                          weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}